

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast_helper.hpp
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
chaiscript::detail::
Cast_Helper<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::cast
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Boxed_Value *ob,Type_Conversions_State *t_conversions)

{
  Type_Conversions_State *t_conversions_local;
  Boxed_Value *ob_local;
  
  Cast_Helper_Inner<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::cast(__return_storage_ptr__,ob,t_conversions);
  return __return_storage_ptr__;
}

Assistant:

static decltype(auto) cast(const Boxed_Value &ob, const Type_Conversions_State *t_conversions) {
        return (Cast_Helper_Inner<T>::cast(ob, t_conversions));
      }